

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yabmpinfo.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  undefined8 uVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  char cVar11;
  code *pcVar12;
  optparse *poVar13;
  optparse *poVar14;
  code *pcVar15;
  int iVar16;
  byte bVar17;
  yabmp_info *l_info;
  optparse optparsecpy;
  optparse optparse;
  FILE *local_128;
  yabmp_info *local_120;
  char *local_118;
  undefined8 local_110;
  char *local_108;
  optparse local_100;
  optparse local_98;
  
  bVar17 = 0;
  local_128 = _stdout;
  pcVar8 = *argv;
  pcVar6 = strrchr(pcVar8,0x2f);
  if (pcVar6 != (char *)0x0) {
    pcVar8 = pcVar6;
  }
  *argv = pcVar8 + (pcVar6 != (char *)0x0);
  optparse_init(&local_98,argv);
  bVar2 = false;
  bVar3 = false;
  bVar1 = false;
  pcVar8 = (char *)0x0;
  while( true ) {
    while (pcVar6 = pcVar8, iVar4 = optparse_long(&local_98,main::options,(int *)0x0),
          pcVar8 = pcVar6, 0x6e < iVar4) {
      pcVar8 = local_98.optarg;
      if (iVar4 != 0x6f) {
        if (iVar4 == 0x71) {
          bVar2 = true;
          pcVar8 = pcVar6;
        }
        else {
          pcVar8 = pcVar6;
          if (iVar4 == 0x76) {
            bVar3 = true;
          }
        }
      }
    }
    if (iVar4 == -1) break;
    if (iVar4 == 0x68) {
      bVar1 = true;
    }
    else if (iVar4 == 0x3f) {
      local_118 = pcVar6;
      main_cold_1();
      iVar4 = 1;
LAB_001026a7:
      cVar11 = '\0';
LAB_001026ae:
      if (((local_128 != (FILE *)0x0) && (local_128 != _stdout)) &&
         (fclose(local_128), iVar4 != 0 && cVar11 == '\0')) {
        remove(local_118);
      }
      return iVar4;
    }
  }
  if (bVar1) {
    pcVar6 = (char *)0x0;
  }
  local_118 = pcVar6;
  if (((pcVar6 != (char *)0x0) && (iVar4 = strcmp(pcVar6,"-"), iVar4 != 0)) &&
     (local_128 = fopen(pcVar6,"wt"), local_128 == (FILE *)0x0)) {
    iVar4 = 1;
    if (!bVar2) {
      fprintf(_stderr,"Can\'t open file %s for writing\n",local_118);
    }
    cVar11 = '\0';
    local_128 = (FILE *)0x0;
    goto LAB_001026ae;
  }
  if (bVar3) {
    pcVar8 = *argv;
    uVar7 = yabmp_get_version_string();
    fprintf(local_128,"%s %s\n",pcVar8,uVar7);
  }
  if (bVar1) {
    pcVar8 = *argv;
    iVar4 = 0;
    fprintf(_stdout,
            "usage:\n%s -h|--help : this help message\n%s -v|--version : print version\n%s [-vqo output] file1 [file2 ...]\n  -v, --version: print version before info\n  -q, --quiet:   no error/warning printed\n  -o, --output:  output filename\n"
            ,pcVar8,pcVar8,pcVar8);
  }
  else {
    pcVar8 = optparse_arg(&local_98);
    if (pcVar8 != (char *)0x0) {
      poVar13 = &local_98;
      poVar14 = &local_100;
      for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
        poVar14->argv = poVar13->argv;
        poVar13 = (optparse *)((long)poVar13 + ((ulong)bVar17 * -2 + 1) * 8);
        poVar14 = (optparse *)((long)poVar14 + (ulong)bVar17 * -0x10 + 8);
      }
      local_108 = optparse_arg(&local_100);
      local_110 = CONCAT71((int7)((ulong)local_108 >> 8),local_108 != (char *)0x0);
      pcVar15 = print_error;
      if (bVar2) {
        pcVar15 = (code *)0x0;
      }
      pcVar12 = print_warning;
      if (bVar2) {
        pcVar12 = (code *)0x0;
      }
      iVar4 = 0;
      pcVar6 = (char *)0x0;
      do {
        local_100.argv = (char **)0x0;
        local_120 = (yabmp_info *)0x0;
        if (local_108 != (char *)0x0) {
          if (pcVar6 != (char *)0x0) {
            fputc(10,local_128);
          }
          pcVar9 = strrchr(pcVar8,0x2f);
          pcVar6 = pcVar9;
          if (pcVar9 == (char *)0x0) {
            pcVar6 = pcVar8;
          }
          fprintf(local_128,"%s:\n",pcVar6 + (pcVar9 != (char *)0x0));
          pcVar6 = pcVar8;
        }
        iVar5 = yabmp_create_reader(&local_100,0,pcVar15,pcVar12,0,0,0);
        iVar16 = 1;
        if ((iVar5 == 0) && (iVar5 = yabmp_create_info(local_100.argv,&local_120), iVar5 == 0)) {
          if ((*pcVar8 == '-') && (pcVar8[1] == '\0')) {
            yabmp_set_input_stream(local_100.argv,_stdin,yabmp_file_read,0);
          }
          else {
            iVar5 = yabmp_set_input_file(local_100.argv,pcVar8);
            if (iVar5 != 0) goto LAB_00102646;
          }
          iVar5 = yabmp_read_info(local_100.argv,local_120);
          if (iVar5 == 0) {
            yabmp_printinfo((FILE *)local_128,(yabmp *)local_100.argv,local_120);
            iVar16 = iVar4;
          }
        }
LAB_00102646:
        iVar4 = iVar16;
        yabmp_destroy_reader(&local_100);
      } while ((iVar4 == 0) && (pcVar8 = optparse_arg(&local_98), pcVar8 != (char *)0x0));
      cVar11 = (char)local_110;
      goto LAB_001026ae;
    }
    iVar4 = 0;
    if ((!bVar3) && (iVar4 = 1, !bVar2)) {
      main_cold_2();
    }
  }
  goto LAB_001026a7;
}

Assistant:

int main(int argc, char* argv[])
{
	static const struct optparse_long options[] = {
		{ "version", 'v', OPTPARSE_NONE },
		{ "help",    'h', OPTPARSE_NONE },
		{ "quiet",   'q', OPTPARSE_NONE },
		{ "output",  'o', OPTPARSE_REQUIRED },
		{ 0 }
	};
	int result = EXIT_SUCCESS;
	int has_multiple_files = 0;
	struct optparse optparse;
	int option;
	struct {
		unsigned int version:1;
		unsigned int help:1;
		unsigned int quiet:1;
	} flags = {0};
	const char* output = NULL;
	const char* input = NULL;
	const char* last_input = NULL;
	FILE* outStream = stdout;
	
	argv[0] = (char*)yabmp_basename(argv[0]);
	
	optparse_init(&optparse, argv);
	
	while ((option = optparse_long(&optparse, options, NULL)) != -1) {
		switch (option) {
			case 'v':
				flags.version = 1;
				break;
			case 'h':
				flags.help = 1;
				break;
			case 'q':
				flags.quiet = 1;
				break;
			case 'o':
				output = optparse.optarg;
				break;
			case '?':
				fprintf(stderr, "%s: %s\n", argv[0], optparse.errmsg);
				print_usage(stderr, argv[0]);
				result = 1;
				goto BADEND;
		}
	}
	
	if (flags.help) {
		output = NULL;
	}
	
	if ((output != NULL) && (strcmp(output, "-") != 0)) {
		outStream = fopen(output, "wt");
		if (outStream == NULL) {
			if (!flags.quiet) {
				fprintf(stderr, "Can't open file %s for writing\n", output);
			}
			result = 1;
			goto BADEND;
		}
	}
	
	if (flags.version) {
		fprintf(outStream, "%s %s\n", argv[0], yabmp_get_version_string());
	}
	if (flags.help) {
		print_usage(stdout, argv[0]);
		goto BADEND;
	}
	
	input = optparse_arg(&optparse);
	if (input == NULL) {
		if (!flags.version) {
			if (!flags.quiet) {
				fprintf(stderr, "%s: missing file1 argument\n", argv[0]);
				print_usage(stderr, argv[0]);
			}
			result = 1;
		}
		goto BADEND;
	}
	
	/* Check for multiple files */
	{
		struct optparse optparsecpy;
		memcpy(&optparsecpy, &optparse, sizeof(optparse));
		if (optparse_arg(&optparsecpy) != NULL) {
			has_multiple_files = 1;
		}
	}
	
	do
	{
		yabmp* l_reader = NULL;
		yabmp_info* l_info = NULL;
		
		if (has_multiple_files) {
			if (last_input != NULL) {
				fputc('\n', outStream);
			}
			last_input = input;
			fprintf(outStream, "%s:\n", yabmp_basename(input));
		}
		if (yabmp_create_reader(&l_reader, NULL, flags.quiet ? NULL : print_error, flags.quiet ? NULL : print_warning, NULL, NULL, NULL) != YABMP_OK) {
			result = 1;
			goto FREE_INSTANCE;
		}
		if (yabmp_create_info(l_reader, &l_info) != YABMP_OK) {
			result = 1;
			goto FREE_INSTANCE;
		}
		if ((input[0] == '-') && (input[1] == '\0')) {
			stream_setmode_binary(stdin, flags.quiet);
			/* This can't fail with proper arguments */
			(void)yabmp_set_input_stream(l_reader, stdin, yabmp_file_read, NULL, NULL);
		} else {
			if (yabmp_set_input_file(l_reader, input) != YABMP_OK) {
				result = 1;
				goto FREE_INSTANCE;
			}
		}
		if (yabmp_read_info(l_reader, l_info) != YABMP_OK) {
			result = 1;
			goto FREE_INSTANCE;
		}
		yabmp_printinfo(outStream, l_reader, l_info);
FREE_INSTANCE:
		yabmp_destroy_reader(&l_reader, &l_info);
		if (result) {
			goto BADEND;
		}
	} while ((input = optparse_arg(&optparse)) != NULL);
BADEND:
	if ((outStream != stdout) && (outStream != NULL)) {
		fclose(outStream);
		if (result && !has_multiple_files) {
			(void)remove(output);
		}
	}
	
	return result;
}